

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

Extra_SymmInfo_t * Extra_SymmPairsComputeNaive(DdManager *dd,DdNode *bFunc)

{
  int nVars;
  int iVar1;
  DdNode *n;
  Extra_SymmInfo_t *pEVar2;
  int local_40;
  int local_3c;
  int k;
  int i;
  Extra_SymmInfo_t *p;
  DdNode *pDStack_28;
  int nSuppSize;
  DdNode *bTemp;
  DdNode *bSupp;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  n = Cudd_Support(dd,bFunc);
  Cudd_Ref(n);
  nVars = Extra_bddSuppSize(dd,n);
  pEVar2 = Extra_SymmPairsAllocate(nVars);
  pEVar2->nVarsMax = dd->size;
  local_3c = 0;
  for (pDStack_28 = n; pDStack_28 != dd->one; pDStack_28 = (pDStack_28->type).kids.T) {
    pEVar2->pVars[local_3c] = pDStack_28->index;
    local_3c = local_3c + 1;
  }
  for (local_3c = 0; local_40 = local_3c, local_3c < nVars; local_3c = local_3c + 1) {
    while (local_40 = local_40 + 1, local_40 < nVars) {
      iVar1 = Extra_bddCheckVarsSymmetricNaive
                        (dd,bFunc,pEVar2->pVars[local_3c],pEVar2->pVars[local_40]);
      pEVar2->pSymms[local_3c][local_40] = (char)iVar1;
      pEVar2->pSymms[local_40][local_3c] = (char)iVar1;
      if (pEVar2->pSymms[local_3c][local_40] != '\0') {
        pEVar2->nSymms = pEVar2->nSymms + 1;
      }
    }
  }
  Cudd_RecursiveDeref(dd,n);
  return pEVar2;
}

Assistant:

Extra_SymmInfo_t * Extra_SymmPairsComputeNaive( DdManager * dd, DdNode * bFunc )
{
    DdNode * bSupp, * bTemp;
    int nSuppSize;
    Extra_SymmInfo_t * p;
    int i, k;

    // compute the support
    bSupp = Cudd_Support( dd, bFunc );   Cudd_Ref( bSupp );
    nSuppSize = Extra_bddSuppSize( dd, bSupp );
//printf( "Support = %d. ", nSuppSize );
//Extra_bddPrint( dd, bSupp );
//printf( "%d ", nSuppSize );

    // allocate the storage for symmetry info
    p = Extra_SymmPairsAllocate( nSuppSize );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
        p->pVars[i] = bTemp->index;

    // go through the candidate pairs and check using Idea1
    for ( i = 0; i < nSuppSize; i++ )
    for ( k = i+1; k < nSuppSize; k++ )
    {
        p->pSymms[k][i] = p->pSymms[i][k] = Extra_bddCheckVarsSymmetricNaive( dd, bFunc, p->pVars[i], p->pVars[k] );
        if ( p->pSymms[i][k] )
             p->nSymms++;
    }

    Cudd_RecursiveDeref( dd, bSupp );
    return p;

}